

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFNode.cpp
# Opt level: O3

int __thiscall FFNode::init(FFNode *this,EVP_PKEY_CTX *ctx)

{
  pointer pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  num_t *w;
  pointer pfVar7;
  result_type rVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  normal_distribution<float> dist;
  normal_distribution<float> local_38;
  
  local_38._M_param._M_stddev =
       (float)SQRT(*(double *)(&DAT_00106210 + (ulong)(this->activation_ == ReLU) * 8) /
                   (double)this->input_size_);
  local_38._M_param._M_mean = 0.0;
  local_38._M_saved = 0.0;
  local_38._M_saved_available = false;
  pfVar1 = (this->weights_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  auVar2 = _DAT_00106230;
  auVar3 = _DAT_00106220;
  auVar4 = _DAT_001061a0;
  for (pfVar7 = (this->weights_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start; _DAT_001061a0 = auVar4, _DAT_00106220 = auVar3,
      _DAT_00106230 = auVar2, pfVar7 != pfVar1; pfVar7 = pfVar7 + 1) {
    rVar8 = std::normal_distribution<float>::operator()
                      (&local_38,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)ctx,&local_38._M_param);
    *pfVar7 = rVar8;
    auVar2 = _DAT_00106230;
    auVar3 = _DAT_00106220;
    auVar4 = _DAT_001061a0;
  }
  pfVar7 = (this->biases_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (this->biases_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar7 != pfVar1) {
    uVar5 = (long)pfVar1 + (-4 - (long)pfVar7);
    auVar12._8_4_ = (int)uVar5;
    auVar12._0_8_ = uVar5;
    auVar12._12_4_ = (int)(uVar5 >> 0x20);
    auVar9._0_8_ = uVar5 >> 2;
    auVar9._8_8_ = auVar12._8_8_ >> 2;
    uVar6 = 0;
    auVar9 = auVar9 ^ auVar4;
    do {
      auVar11._8_4_ = (int)uVar6;
      auVar11._0_8_ = uVar6;
      auVar11._12_4_ = (int)(uVar6 >> 0x20);
      auVar12 = (auVar11 | auVar2) ^ auVar4;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ || iVar10 < auVar12._4_4_
                  ) & 1)) {
        pfVar7[uVar6] = 0.01;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        pfVar7[uVar6 + 1] = 0.01;
      }
      auVar12 = (auVar11 | auVar3) ^ auVar4;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar12._0_4_ <= auVar9._0_4_)) {
        pfVar7[uVar6 + 2] = 0.01;
        pfVar7[uVar6 + 3] = 0.01;
      }
      uVar6 = uVar6 + 4;
    } while (((uVar5 >> 2) + 4 & 0xfffffffffffffffc) != uVar6);
  }
  return (int)pfVar7;
}

Assistant:

void FFNode::init(rne_t& rne)
{
    num_t sigma;
    switch (activation_)
    {
    case Activation::ReLU:
        // Kaiming He, et. al. weight initialization for ReLU networks
        // https://arxiv.org/pdf/1502.01852.pdf
        //
        // Suggests using a normal distribution with variance := 2 / n_in
        sigma = std::sqrt(2.0 / static_cast<num_t>(input_size_));
        break;
    case Activation::Softmax:
    default:
        sigma = std::sqrt(1.0 / static_cast<num_t>(input_size_));
        break;
    }

    // NOTE: Unfortunately, the C++ standard does not guarantee that the results
    // obtained from a distribution function will be identical given the same
    // inputs across different compilers and platforms. A production ML
    // framework will likely implement its own distributions to provide
    // deterministic results.
    auto dist = std::normal_distribution<num_t>{0.0, sigma};

    for (num_t& w : weights_)
    {
        w = dist(rne);
    }

    // NOTE: Setting biases to zero is a common practice, as is initializing the
    // bias to a small value (e.g. on the order of 0.01). It is unclear if the
    // latter produces a consistent result over the former, but the thinking is
    // that a non-zero bias will ensure that the neuron always "fires" at the
    // beginning to produce a signal.
    //
    // Here, we initialize all biases to a small number, but the reader should
    // consider experimenting with other approaches.
    for (num_t& b : biases_)
    {
        b = 0.01;
    }
}